

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectExpression.h
# Opt level: O2

void __thiscall ObjectExpression::ObjectExpression(ObjectExpression *this)

{
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR_evaluate_00135be8;
  (this->expressionMap)._M_h._M_buckets = &(this->expressionMap)._M_h._M_single_bucket;
  (this->expressionMap)._M_h._M_bucket_count = 1;
  (this->expressionMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->expressionMap)._M_h._M_element_count = 0;
  (this->expressionMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->expressionMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->expressionMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->functionMap)._M_h._M_buckets = &(this->functionMap)._M_h._M_single_bucket;
  (this->functionMap)._M_h._M_bucket_count = 1;
  (this->functionMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->functionMap)._M_h._M_element_count = 0;
  (this->functionMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->functionMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->functionMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit ObjectExpression() = default;